

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O0

void decaf_448_point_mul_by_ratio_and_encode_like_eddsa(uint8_t *enc,decaf_448_point_s *p)

{
  mask_t mVar1;
  long in_RDI;
  gf_448_t u;
  decaf_448_point_t q;
  gf_448_t t;
  gf_448_t z;
  gf_448_t y;
  gf_448_t x;
  decaf_448_point_s *in_stack_fffffffffffffd80;
  decaf_448_point_s *in_stack_fffffffffffffd88;
  gf_448_s *in_stack_fffffffffffffdc8;
  gf_448_s *in_stack_fffffffffffffe08;
  uint8_t *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe24;
  gf_448_s *in_stack_fffffffffffffe28;
  gf_448_s *in_stack_fffffffffffffe30;
  gf_448_s *in_stack_fffffffffffffec0;
  gf_448_s *in_stack_fffffffffffffec8;
  undefined1 local_100 [8];
  gf_448_s *in_stack_ffffffffffffff08;
  gf_448_s *in_stack_ffffffffffffff10;
  gf_448_s *in_stack_ffffffffffffff18;
  gf_448_s local_c0;
  gf_448_s local_80;
  long local_38;
  
  local_38 = in_RDI;
  decaf_448_point_copy(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  gf_448_sqr(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  gf_448_sqr(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  gf_448_add((gf_448_s *)&stack0xfffffffffffffd80,&local_80,(gf_448_s *)&stack0xfffffffffffffec0);
  gf_448_add((gf_448_s *)local_100,(gf_448_s *)&stack0xfffffffffffffe00,
             (gf_448_s *)&stack0xfffffffffffffdc0);
  gf_448_sqr(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  gf_448_sub(&local_c0,&local_c0,(gf_448_s *)&stack0xfffffffffffffd80);
  gf_448_sub((gf_448_s *)local_100,(gf_448_s *)&stack0xfffffffffffffec0,&local_80);
  gf_448_sqr(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  gf_448_add((gf_448_s *)&stack0xfffffffffffffec0,&local_80,&local_80);
  gf_448_sub((gf_448_s *)&stack0xfffffffffffffec0,(gf_448_s *)&stack0xfffffffffffffec0,
             (gf_448_s *)local_100);
  gf_448_mul(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  gf_448_mul(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  gf_448_mul(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  decaf_bzero(&stack0xfffffffffffffd80,0x40);
  gf_invert(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  gf_448_mul(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  gf_448_mul(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  *(undefined1 *)(local_38 + 0x38) = 0;
  gf_448_serialize(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  mVar1 = gf_448_lobit(in_stack_fffffffffffffdc8);
  *(byte *)(local_38 + 0x38) = *(byte *)(local_38 + 0x38) | (byte)mVar1 & 0x80;
  decaf_bzero(&local_80,0x40);
  decaf_bzero(&local_c0,0x40);
  decaf_bzero(local_100,0x40);
  decaf_bzero(&stack0xfffffffffffffec0,0x40);
  decaf_448_point_destroy((decaf_448_point_s *)0x12d5a3);
  return;
}

Assistant:

void API_NS(point_mul_by_ratio_and_encode_like_eddsa) (
    uint8_t enc[DECAF_EDDSA_448_PUBLIC_BYTES],
    const point_t p
) {
    
    /* The point is now on the twisted curve.  Move it to untwisted. */
    gf x, y, z, t;
    point_t q;
#if COFACTOR == 8
    API_NS(point_double)(q,p);
#else
    API_NS(point_copy)(q,p);
#endif
    
#if EDDSA_USE_SIGMA_ISOGENY
    {
        /* Use 4-isogeny like ed25519:
         *   2*x*y*sqrt(d/a-1)/(ax^2 + y^2 - 2)
         *   (y^2 - ax^2)/(y^2 + ax^2)
         * with a = -1, d = -EDWARDS_D:
         *   -2xysqrt(EDWARDS_D-1)/(2z^2-y^2+x^2)
         *   (y^2+x^2)/(y^2-x^2)
         */
        gf u;
        gf_sqr ( x, q->x ); // x^2
        gf_sqr ( t, q->y ); // y^2
        gf_add( u, x, t ); // x^2 + y^2
        gf_add( z, q->y, q->x );
        gf_sqr ( y, z);
        gf_sub ( y, u, y ); // -2xy
        gf_sub ( z, t, x ); // y^2 - x^2
        gf_sqr ( x, q->z );
        gf_add ( t, x, x);
        gf_sub ( t, t, z);  // 2z^2 - y^2 + x^2
        gf_mul ( x, y, z ); // 2xy(y^2-x^2)
        gf_mul ( y, u, t ); // (x^2+y^2)(2z^2-y^2+x^2)
        gf_mul ( u, z, t );
        gf_copy( z, u );
        gf_mul ( u, x, RISTRETTO_FACTOR );
#if IMAGINE_TWIST
        gf_mul_i( x, u );
#else
#error "... probably wrong"
        gf_copy( x, u );
#endif
        decaf_bzero(u,sizeof(u));
    }
#elif IMAGINE_TWIST
    {
        API_NS(point_double)(q,q);
        API_NS(point_double)(q,q);
        gf_mul_i(x, q->x);
        gf_copy(y, q->y);
        gf_copy(z, q->z);
    }
#else
    {
        /* 4-isogeny: 2xy/(y^+x^2), (y^2-x^2)/(2z^2-y^2+x^2) */
        gf u;
        gf_sqr ( x, q->x );
        gf_sqr ( t, q->y );
        gf_add( u, x, t );
        gf_add( z, q->y, q->x );
        gf_sqr ( y, z);
        gf_sub ( y, y, u );
        gf_sub ( z, t, x );
        gf_sqr ( x, q->z );
        gf_add ( t, x, x); 
        gf_sub ( t, t, z);
        gf_mul ( x, t, y );
        gf_mul ( y, z, u );
        gf_mul ( z, u, t );
        decaf_bzero(u,sizeof(u));
    }
#endif
    /* Affinize */
    gf_invert(z,z,1);
    gf_mul(t,x,z);
    gf_mul(x,y,z);
    
    /* Encode */
    enc[DECAF_EDDSA_448_PRIVATE_BYTES-1] = 0;
    gf_serialize(enc, x);
    enc[DECAF_EDDSA_448_PRIVATE_BYTES-1] |= 0x80 & gf_lobit(t);

    decaf_bzero(x,sizeof(x));
    decaf_bzero(y,sizeof(y));
    decaf_bzero(z,sizeof(z));
    decaf_bzero(t,sizeof(t));
    API_NS(point_destroy)(q);
}